

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# set_timings.c
# Opt level: O0

void dump_regs(int cnum,FILE *outf,uint32_t *ref_val,int ref_exist,uint32_t reg,uint32_t regs_len,
              color color)

{
  uint32_t dest;
  uint local_34;
  int r;
  uint32_t val;
  uint32_t regs_len_local;
  uint32_t reg_local;
  int ref_exist_local;
  uint32_t *ref_val_local;
  FILE *outf_local;
  int cnum_local;
  
  for (local_34 = 0; local_34 < regs_len; local_34 = local_34 + 4) {
    if ((int)local_34 % 0x10 == 0) {
      fprintf((FILE *)outf,"%08x: ",(ulong)(reg + local_34));
    }
    dest = nva_rd32(cnum,reg + local_34);
    print_reg_diff(outf,ref_val[(int)local_34],dest,color);
    if (ref_exist == 0) {
      ref_val[(int)local_34] = dest;
    }
    if ((int)local_34 % 0x10 == 0xc) {
      fprintf((FILE *)outf,"\n");
    }
  }
  return;
}

Assistant:

static void
dump_regs(int cnum, FILE* outf, uint32_t ref_val[], int ref_exist, uint32_t reg, uint32_t regs_len, enum color color)
{
	uint32_t val;
	int r;

	for (r = 0; r < regs_len; r+=4)
        {
                if (r % 0x10 == 0)
                        fprintf(outf, "%08x: ", reg + r);

                val = nva_rd32(cnum, reg + r);

                print_reg_diff(outf, ref_val[r], val, color);

                /* if the value wasn't initialized before, store it as a reference */
                if (ref_exist == 0)
                        ref_val[r] = val;

                if (r % 0x10 == 0xc)
                        fprintf(outf, "\n");
        }
}